

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truncated_normal_dist.hpp
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,param_type *P)

{
  undefined4 uVar1;
  ostream *poVar2;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  poVar2 = std::operator<<(out,'(');
  *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8) = 7;
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,P->mu_);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,P->sigma_);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,P->a_);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,P->b_);
  std::operator<<(poVar2,')');
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const param_type &P) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << std::setprecision(math::numeric_limits<float_t>::digits10 + 1) << P.mu()
            << ' ' << P.sigma() << ' ' << P.a() << ' ' << P.b() << ')';
        out.flags(flags);
        return out;
      }